

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O0

int sfglx_LoadFunctions(Display *display,int screen)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  char *in_stack_00000040;
  
  ClearExtensionVars();
  glXQueryExtensionsString(in_RDI,in_ESI);
  ProcExtsFromExtString(in_stack_00000040);
  return 1;
}

Assistant:

int sfglx_LoadFunctions(Display* display, int screen)
{
    ClearExtensionVars();


    ProcExtsFromExtString(reinterpret_cast<const char*>(glXQueryExtensionsString(display, screen)));
    return sfglx_LOAD_SUCCEEDED;
}